

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

Gia_Man_t * Gia_ManDupCollapse(Gia_Man_t *p,Gia_Man_t *pBoxes,Vec_Int_t *vBoxPres,int fSeq)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *p_01;
  bool bVar10;
  int local_12c;
  uint local_d0;
  uint local_bc;
  int local_84;
  int i_1;
  Gia_Obj_t *pObj_1;
  char *pInit;
  int fSkip;
  int nNewPis;
  int nBBouts;
  int nBBins;
  int curCo;
  int curCi;
  int k;
  int i;
  Gia_Obj_t *pObjBox;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Tim_Man_t *pManTime;
  int fSeq_local;
  Vec_Int_t *vBoxPres_local;
  Gia_Man_t *pBoxes_local;
  Gia_Man_t *p_local;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  nNewPis = 0;
  fSkip = 0;
  pInit._4_4_ = 0;
  if ((fSeq != 0) && (p->vRegClasses == (Vec_Int_t *)0x0)) {
    __assert_fail("!fSeq || p->vRegClasses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x329,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  iVar1 = Gia_ManCiNum(p);
  iVar2 = Tim_ManPiNum(p_00);
  iVar3 = Gia_ManCoNum(pBoxes);
  if (iVar1 != iVar2 + iVar3) {
    __assert_fail("Gia_ManCiNum(p) == Tim_ManPiNum(pManTime) + Gia_ManCoNum(pBoxes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x32b,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  iVar1 = Gia_ManObjNum(p);
  pGVar5 = Gia_ManStart(iVar1);
  pcVar6 = Abc_UtilStrsav(p->pName);
  pGVar5->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  pGVar5->pSpec = pcVar6;
  iVar1 = Gia_ManHasChoices(p);
  if (iVar1 != 0) {
    iVar1 = Gia_ManObjNum(p);
    piVar7 = (int *)calloc((long)iVar1,4);
    pGVar5->pSibls = piVar7;
  }
  Gia_ManHashAlloc(pGVar5);
  Gia_ManFillValue(p);
  pGVar8 = Gia_ManConst0(p);
  pGVar8->Value = 0;
  Gia_ManIncrementTravId(p);
  pGVar8 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar8);
  for (curCi = 0; iVar1 = Tim_ManPiNum(p_00), curCi < iVar1; curCi = curCi + 1) {
    pGVar8 = Gia_ManCi(p,curCi);
    uVar4 = Gia_ManAppendCi(pGVar5);
    pGVar8->Value = uVar4;
    Gia_ObjSetTravIdCurrent(p,pGVar8);
  }
  nBBins = Tim_ManPiNum(p_00);
  nBBouts = 0;
  for (curCi = 0; iVar1 = Tim_ManBoxNum(p_00), curCi < iVar1; curCi = curCi + 1) {
    Gia_ManIncrementTravId(pBoxes);
    pGVar8 = Gia_ManConst0(pBoxes);
    Gia_ObjSetTravIdCurrent(pBoxes,pGVar8);
    pGVar8 = Gia_ManConst0(pBoxes);
    pGVar8->Value = 0;
    iVar1 = Tim_ManBoxIsBlack(p_00,curCi);
    if (iVar1 == 0) {
      for (curCo = 0; iVar1 = Tim_ManBoxInputNum(p_00,curCi), curCo < iVar1; curCo = curCo + 1) {
        pGVar8 = Gia_ManCo(p,nBBouts + curCo);
        pGVar9 = Gia_ObjFanin0(pGVar8);
        Gia_ManDupCollapse_rec(p,pGVar9,pGVar5);
        pGVar9 = Gia_ManCi(pBoxes,curCo);
        uVar4 = Gia_ObjFanin0Copy(pGVar8);
        pGVar9->Value = uVar4;
        Gia_ObjSetTravIdCurrent(pBoxes,pGVar9);
      }
      for (curCo = 0; iVar1 = Tim_ManBoxOutputNum(p_00,curCi), curCo < iVar1; curCo = curCo + 1) {
        iVar1 = Tim_ManPiNum(p_00);
        pGVar8 = Gia_ManCo(pBoxes,(nBBins - iVar1) + curCo);
        pGVar9 = Gia_ObjFanin0(pGVar8);
        Gia_ManDupCollapse_rec(pBoxes,pGVar9,pGVar5);
        pGVar9 = Gia_ManCi(p,nBBins + curCo);
        uVar4 = Gia_ObjFanin0Copy(pGVar8);
        pGVar9->Value = uVar4;
        Gia_ObjSetTravIdCurrent(p,pGVar9);
      }
    }
    else {
      bVar10 = false;
      if (vBoxPres != (Vec_Int_t *)0x0) {
        iVar1 = Vec_IntEntry(vBoxPres,curCi);
        bVar10 = iVar1 == 0;
      }
      for (curCo = 0; iVar1 = Tim_ManBoxInputNum(p_00,curCi), curCo < iVar1; curCo = curCo + 1) {
        pGVar8 = Gia_ManCo(p,nBBouts + curCo);
        pGVar9 = Gia_ObjFanin0(pGVar8);
        Gia_ManDupCollapse_rec(p,pGVar9,pGVar5);
        if (bVar10) {
          local_bc = 0xffffffff;
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(pGVar8);
          local_bc = Gia_ManAppendCo(pGVar5,iVar1);
        }
        pGVar8->Value = local_bc;
        fSkip = fSkip + 1;
      }
      for (curCo = 0; iVar1 = Tim_ManBoxOutputNum(p_00,curCi), curCo < iVar1; curCo = curCo + 1) {
        pGVar8 = Gia_ManCi(p,nBBins + curCo);
        if (bVar10) {
          local_d0 = 0;
        }
        else {
          local_d0 = Gia_ManAppendCi(pGVar5);
        }
        pGVar8->Value = local_d0;
        Gia_ObjSetTravIdCurrent(p,pGVar8);
        nNewPis = nNewPis + 1;
        pInit._4_4_ = (uint)((bVar10 ^ 0xffU) & 1) + pInit._4_4_;
      }
    }
    iVar1 = Tim_ManBoxInputNum(p_00,curCi);
    nBBouts = iVar1 + nBBouts;
    iVar1 = Tim_ManBoxOutputNum(p_00,curCi);
    nBBins = iVar1 + nBBins;
  }
  iVar1 = Tim_ManCoNum(p_00);
  iVar2 = Tim_ManPoNum(p_00);
  for (curCi = iVar1 - iVar2; iVar1 = Tim_ManCoNum(p_00), curCi < iVar1; curCi = curCi + 1) {
    pGVar8 = Gia_ManCo(p,curCi);
    pGVar9 = Gia_ObjFanin0(pGVar8);
    Gia_ManDupCollapse_rec(p,pGVar9,pGVar5);
    iVar1 = Gia_ObjFanin0Copy(pGVar8);
    uVar4 = Gia_ManAppendCo(pGVar5,iVar1);
    pGVar8->Value = uVar4;
  }
  iVar1 = Tim_ManPoNum(p_00);
  iVar2 = Gia_ManCiNum(p);
  if (nBBins != iVar2) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x37f,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  iVar2 = Gia_ManCoNum(p);
  if (iVar1 + nBBouts != iVar2) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x380,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  if ((fSeq == 0) || (p->vRegClasses == (Vec_Int_t *)0x0)) {
    local_12c = Gia_ManRegNum(p);
  }
  else {
    local_12c = Vec_IntSize(p->vRegClasses);
  }
  Gia_ManSetRegNum(pGVar5,local_12c);
  Gia_ManHashStop(pGVar5);
  p_01 = Gia_ManCleanup(pGVar5);
  Gia_ManCleanupRemap(p,pGVar5);
  Gia_ManStop(pGVar5);
  pTemp = p_01;
  if (pInit._4_4_ != 0) {
    iVar1 = Tim_ManPiNum(p_00);
    iVar2 = Gia_ManRegNum(p_01);
    pTemp = Gia_ManDupMoveLast(p_01,iVar1 - iVar2,pInit._4_4_);
    Gia_ManCleanupRemap(p,p_01);
    Gia_ManStop(p_01);
  }
  if (vBoxPres == (Vec_Int_t *)0x0) {
    iVar1 = Tim_ManPoNum(p_00);
    iVar2 = Gia_ManCoNum(pTemp);
    if (iVar1 != iVar2 - fSkip) {
      __assert_fail("vBoxPres != NULL || Tim_ManPoNum(pManTime) == Gia_ManCoNum(pNew) - nBBouts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x395,
                    "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
    }
  }
  if (vBoxPres == (Vec_Int_t *)0x0) {
    iVar1 = Tim_ManPiNum(p_00);
    iVar2 = Gia_ManCiNum(pTemp);
    if (iVar1 != iVar2 - nNewPis) {
      __assert_fail("vBoxPres != NULL || Tim_ManPiNum(pManTime) == Gia_ManCiNum(pNew) - nBBins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x396,
                    "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
    }
  }
  if (((fSeq != 0) && (p->vRegInits != (Vec_Int_t *)0x0)) &&
     (iVar1 = Vec_IntSum(p->vRegInits), iVar1 != 0)) {
    iVar1 = Vec_IntSize(p->vRegInits);
    pcVar6 = (char *)malloc((long)(iVar1 + 1));
    iVar1 = Vec_IntSize(p->vRegInits);
    iVar2 = Gia_ManRegNum(pTemp);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_IntSize(p->vRegInits) == Gia_ManRegNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x39d,
                    "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
    }
    local_84 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(pTemp);
      bVar10 = false;
      if (local_84 < iVar1) {
        iVar1 = Gia_ManPiNum(pTemp);
        pGVar8 = Gia_ManCi(pTemp,iVar1 + local_84);
        bVar10 = pGVar8 != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar1 = Vec_IntEntry(p->vRegInits,local_84);
      if (iVar1 == 0) {
        pcVar6[local_84] = '0';
      }
      else {
        iVar1 = Vec_IntEntry(p->vRegInits,local_84);
        if (iVar1 == 1) {
          pcVar6[local_84] = '1';
        }
        else {
          pcVar6[local_84] = 'X';
        }
      }
      local_84 = local_84 + 1;
    }
    pcVar6[local_84] = '\0';
    pGVar5 = Gia_ManDupZeroUndc(pTemp,pcVar6,0,0,1);
    pGVar5->nConstrs = pTemp->nConstrs;
    pTemp->nConstrs = 0;
    Gia_ManStop(pTemp);
    pTemp = pGVar5;
    if (pcVar6 != (char *)0x0) {
      free(pcVar6);
    }
  }
  return pTemp;
}

Assistant:

Gia_Man_t * Gia_ManDupCollapse( Gia_Man_t * p, Gia_Man_t * pBoxes, Vec_Int_t * vBoxPres, int fSeq )
{
    // this procedure assumes that sequential AIG with boxes is unshuffled to have valid boxes
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjBox;
    int i, k, curCi, curCo, nBBins = 0, nBBouts = 0, nNewPis = 0;
    assert( !fSeq || p->vRegClasses );
    //assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCiNum(p) == Tim_ManPiNum(pManTime) + Gia_ManCoNum(pBoxes) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManHashAlloc( pNew );
    // copy const and real PIs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        pObj->Value = Gia_ManAppendCi(pNew);
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        // clean boxes
        Gia_ManIncrementTravId( pBoxes );
        Gia_ObjSetTravIdCurrent( pBoxes, Gia_ManConst0(pBoxes) );
        Gia_ManConst0(pBoxes)->Value = 0;
        // add internal nodes
        //printf( "%d ", Tim_ManBoxIsBlack(pManTime, i) );
        if ( Tim_ManBoxIsBlack(pManTime, i) )
        {
            int fSkip = (vBoxPres != NULL && !Vec_IntEntry(vBoxPres, i));
            for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
            {
                pObj = Gia_ManCo( p, curCo + k );
                Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
                pObj->Value = fSkip ? -1 : Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                nBBouts++;
            }
            for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            {
                pObj = Gia_ManCi( p, curCi + k );
                pObj->Value = fSkip ? 0 : Gia_ManAppendCi(pNew);
                Gia_ObjSetTravIdCurrent( p, pObj );
                nBBins++;
                nNewPis += !fSkip;
            }
        }
        else
        {
            for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
            {
                // build logic
                pObj = Gia_ManCo( p, curCo + k );
                Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
                // transfer to the PI
                pObjBox = Gia_ManCi( pBoxes, k );
                pObjBox->Value = Gia_ObjFanin0Copy(pObj);
                Gia_ObjSetTravIdCurrent( pBoxes, pObjBox );
            }
            for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            {
                // build logic
                pObjBox = Gia_ManCo( pBoxes, curCi - Tim_ManPiNum(pManTime) + k );
                Gia_ManDupCollapse_rec( pBoxes, Gia_ObjFanin0(pObjBox), pNew );
                // transfer to the PI
                pObj = Gia_ManCi( p, curCi + k );
                pObj->Value = Gia_ObjFanin0Copy(pObjBox);
                Gia_ObjSetTravIdCurrent( p, pObj );
            }
        }
        curCo += Tim_ManBoxInputNum(pManTime, i);
        curCi += Tim_ManBoxOutputNum(pManTime, i);
    }
    //printf( "\n" );
    // add remaining nodes
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    Gia_ManSetRegNum( pNew, (fSeq && p->vRegClasses) ? Vec_IntSize(p->vRegClasses) : Gia_ManRegNum(p) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManCleanupRemap( p, pTemp );
    Gia_ManStop( pTemp );
    if ( nNewPis )
    {
        pNew = Gia_ManDupMoveLast( pTemp = pNew, Tim_ManPiNum(pManTime)-Gia_ManRegNum(pNew), nNewPis );
        Gia_ManCleanupRemap( p, pTemp );
        Gia_ManStop( pTemp );
    }
/*
    printf( "%d = %d - %d    Diff = %d\n", 
        Tim_ManPoNum(pManTime),   Gia_ManCoNum(pNew),  nBBouts, 
        Tim_ManPoNum(pManTime) - (Gia_ManCoNum(pNew) - nBBouts) );

    printf( "%d = %d - %d    Diff = %d\n\n", 
        Tim_ManPiNum(pManTime),   Gia_ManCiNum(pNew),  nBBins, 
        Tim_ManPiNum(pManTime) - (Gia_ManCiNum(pNew) - nBBins) );
*/
    assert( vBoxPres != NULL || Tim_ManPoNum(pManTime) == Gia_ManCoNum(pNew) - nBBouts );
    assert( vBoxPres != NULL || Tim_ManPiNum(pManTime) == Gia_ManCiNum(pNew) - nBBins );
    // implement initial state if given
    if ( fSeq && p->vRegInits && Vec_IntSum(p->vRegInits) )
    {
        char * pInit = ABC_ALLOC( char, Vec_IntSize(p->vRegInits) + 1 );
        Gia_Obj_t * pObj;
        int i;
        assert( Vec_IntSize(p->vRegInits) == Gia_ManRegNum(pNew) );
        Gia_ManForEachRo( pNew, pObj, i )
        {
            if ( Vec_IntEntry(p->vRegInits, i) == 0 )
                pInit[i] = '0';
            else if ( Vec_IntEntry(p->vRegInits, i) == 1 )
                pInit[i] = '1';
            else 
                pInit[i] = 'X';
        }
        pInit[i] = 0;
        pNew = Gia_ManDupZeroUndc( pTemp = pNew, pInit, 0, 0, 1 );
        pNew->nConstrs = pTemp->nConstrs; pTemp->nConstrs = 0;
        Gia_ManStop( pTemp );
        ABC_FREE( pInit );
    }
    return pNew;
}